

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

int Ndr_ObjReadRange(Ndr_Data_t *p,int Obj,int *End,int *Beg)

{
  int iVar1;
  uint local_40;
  int Signed;
  int nArray;
  int *pArray;
  int *Beg_local;
  int *End_local;
  Ndr_Data_t *pNStack_18;
  int Obj_local;
  Ndr_Data_t *p_local;
  
  pArray = Beg;
  Beg_local = End;
  End_local._4_4_ = Obj;
  pNStack_18 = p;
  iVar1 = Ndr_ObjReadArray(p,Obj,8,(int **)&Signed);
  *pArray = 0;
  *Beg_local = 0;
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    local_40 = (uint)(iVar1 == 3);
    if (iVar1 == 1) {
      iVar1 = *_Signed;
      *pArray = iVar1;
      *Beg_local = iVar1;
    }
    else {
      *Beg_local = *_Signed;
      *pArray = _Signed[1];
    }
    p_local._4_4_ = local_40;
  }
  return p_local._4_4_;
}

Assistant:

int Ndr_ObjReadRange( Ndr_Data_t * p, int Obj, int * End, int * Beg )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    int Signed = 0; *End = *Beg = 0;
    if ( nArray == 0 )
        return 0;
    if ( nArray == 3 )
        Signed = 1;
    if ( nArray == 1 )
        *End = *Beg = pArray[0];
    else
        *End = pArray[0], *Beg = pArray[1];
    return Signed;
}